

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

asn_enc_rval_t *
INTEGER_encode_uper(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  int iVar1;
  asn_per_constraint_flags aVar2;
  ssize_t sVar3;
  uint32_t bits;
  uint8_t *puVar4;
  uint8_t *src;
  long value;
  unsigned_long uval;
  asn_per_outp_t *local_38;
  
  value = 0;
  if ((sptr == (void *)0x0) || (*(int *)((long)sptr + 8) == 0)) goto LAB_00140192;
  if ((constraints == (asn_per_constraints_t *)0x0) &&
     (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
LAB_001401b0:
    src = *sptr;
    puVar4 = src + *(int *)((long)sptr + 8);
    local_38 = po;
    for (; src < puVar4; src = src + sVar3) {
      sVar3 = uper_put_length(po,(long)puVar4 - (long)src);
      if ((sVar3 < 0) || (iVar1 = per_put_many_bits(po,src,(int)sVar3 * 8), iVar1 != 0))
      goto LAB_00140149;
    }
LAB_0014017e:
    __return_storage_ptr__->encoded = 0;
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  if ((td->specifics == (void *)0x0) || (*(int *)((long)td->specifics + 0x20) == 0)) {
    iVar1 = asn_INTEGER2long((INTEGER_t *)sptr,&value);
    if (iVar1 == 0) {
      aVar2 = (constraints->value).flags;
      if ((aVar2 & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
        bits = 0;
        if (((constraints->value).range_bits < 0) ||
           (((constraints->value).lower_bound <= value &&
            (value <= (constraints->value).upper_bound)))) goto LAB_00140129;
        if ((aVar2 & APC_EXTENSIBLE) == APC_UNCONSTRAINED) goto LAB_00140192;
        bits = 1;
LAB_00140138:
        iVar1 = per_put_few_bits(po,bits,1);
        if (iVar1 != 0) {
LAB_00140149:
          __return_storage_ptr__->encoded = -1;
          __return_storage_ptr__->failed_type = td;
          goto LAB_0014019a;
        }
        if (bits != 0) goto LAB_001401b0;
      }
      else {
        bits = (uint32_t)(value < (constraints->value).lower_bound);
LAB_00140129:
        if ((aVar2 & APC_EXTENSIBLE) != APC_UNCONSTRAINED) goto LAB_00140138;
        if (bits != 0) goto LAB_00140192;
      }
      iVar1 = (constraints->value).range_bits;
      if (iVar1 < 0) {
        if ((constraints->value).lower_bound == 0) goto LAB_001401b0;
      }
      else {
        iVar1 = uper_put_constrained_whole_number_u
                          (po,value - (constraints->value).lower_bound,iVar1);
        if (iVar1 == 0) goto LAB_0014017e;
      }
    }
  }
  else {
    iVar1 = asn_INTEGER2ulong((INTEGER_t *)sptr,&uval);
    if (iVar1 == 0) {
      aVar2 = (constraints->value).flags;
      if ((aVar2 & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
        bits = 0;
        if ((-1 < (constraints->value).range_bits) &&
           ((uval < (ulong)(constraints->value).lower_bound ||
            ((ulong)(constraints->value).upper_bound < uval)))) {
          bits = 1;
        }
      }
      else {
        bits = (uint32_t)(uval < (ulong)(constraints->value).lower_bound);
      }
      value = uval;
      goto LAB_00140129;
    }
  }
LAB_00140192:
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
LAB_0014019a:
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_enc_rval_t er;
	INTEGER_t *st = (INTEGER_t *)sptr;
	const uint8_t *buf;
	const uint8_t *end;
	asn_per_constraint_t *ct;
	long value = 0;
	unsigned long v = 0;

	if(!st || st->size == 0) ASN__ENCODE_FAILED;

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	er.encoded = 0;

	if(ct) {
		int inext = 0;
		if(specs && specs->field_unsigned) {
			unsigned long uval;
			if(asn_INTEGER2ulong(st, &uval))
				ASN__ENCODE_FAILED;
			/* Check proper range */
			if(ct->flags & APC_SEMI_CONSTRAINED) {
				if(uval < (unsigned long)ct->lower_bound)
					inext = 1;
			} else if(ct->range_bits >= 0) {
				if(uval < (unsigned long)ct->lower_bound
				|| uval > (unsigned long)ct->upper_bound)
					inext = 1;
			}
			ASN_DEBUG("Value %lu (%02x/%d) lb %lu ub %lu %s",
				uval, st->buf[0], st->size,
				ct->lower_bound, ct->upper_bound,
				inext ? "ext" : "fix");
			value = uval;
		} else {
			if(asn_INTEGER2long(st, &value))
				ASN__ENCODE_FAILED;
			/* Check proper range */
			if(ct->flags & APC_SEMI_CONSTRAINED) {
				if(value < ct->lower_bound)
					inext = 1;
			} else if(ct->range_bits >= 0) {
				if(value < ct->lower_bound
				|| value > ct->upper_bound)
					inext = 1;
			}
			ASN_DEBUG("Value %ld (%02x/%d) lb %ld ub %ld %s",
				value, st->buf[0], st->size,
				ct->lower_bound, ct->upper_bound,
				inext ? "ext" : "fix");
		}
		if(ct->flags & APC_EXTENSIBLE) {
			if(per_put_few_bits(po, inext, 1))
				ASN__ENCODE_FAILED;
			if(inext) ct = 0;
		} else if(inext) {
			ASN__ENCODE_FAILED;
		}
	}


	/* X.691-11/2008, #13.2.2, test if constrained whole number */
	if(ct && ct->range_bits >= 0) {
		/* #11.5.6 -> #11.3 */
		ASN_DEBUG("Encoding integer %ld (%lu) with range %d bits",
			value, value - ct->lower_bound, ct->range_bits);
		v = value - ct->lower_bound;
		if(uper_put_constrained_whole_number_u(po, v, ct->range_bits))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	if(ct && ct->lower_bound) {
		ASN_DEBUG("Adjust lower bound to %ld", ct->lower_bound);
		/* TODO: adjust lower bound */
		ASN__ENCODE_FAILED;
	}

	for(buf = st->buf, end = st->buf + st->size; buf < end;) {
		ssize_t mayEncode = uper_put_length(po, end - buf);
		if(mayEncode < 0)
			ASN__ENCODE_FAILED;
		if(per_put_many_bits(po, buf, 8 * mayEncode))
			ASN__ENCODE_FAILED;
		buf += mayEncode;
	}

	ASN__ENCODED_OK(er);
}